

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest_Fac_Test::InterpTest_Fac_Test(InterpTest_Fac_Test *this)

{
  Features local_18;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_002ce910;
  local_18.exceptions_enabled_ = false;
  local_18.mutable_globals_enabled_ = true;
  local_18.sat_float_to_int_enabled_ = true;
  local_18.sign_extension_enabled_ = true;
  local_18.simd_enabled_ = false;
  local_18.threads_enabled_ = false;
  local_18.multi_value_enabled_ = true;
  local_18.tail_call_enabled_ = false;
  local_18.bulk_memory_enabled_ = false;
  local_18.reference_types_enabled_ = false;
  local_18.annotations_enabled_ = false;
  local_18.gc_enabled_ = false;
  local_18.memory64_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpTest).store_,&local_18);
  memset(&(this->super_InterpTest).module_desc_,0,0x150);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_002ce350;
  return;
}

Assistant:

TEST_F(InterpTest, Fac) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  Result result = func->Call(store_, {Value::Make(5)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(120u, results[0].Get<u32>());
}